

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_exposed_annotated_type.cpp
# Opt level: O3

int main(void)

{
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  *this;
  undefined8 *puVar1;
  long lVar2;
  unique_ptr<T,_std::default_delete<T>_> object;
  __uniq_ptr_impl<T,_std::default_delete<T>_> local_20;
  
  this = (scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
          *)operator_new(0x18);
  this->injector_ =
       (injector *)
       boost::ext::di::v1_3_0::scopes::instance::
       scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
       ::
       injector_impl<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_void,_boost::ext::di::v1_3_0::core::none>_>_>
       ::
       create<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>
       ::impl;
  this[1].injector_ =
       (injector *)
       boost::ext::di::v1_3_0::scopes::instance::
       scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
       ::
       injector_impl<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_void,_boost::ext::di::v1_3_0::core::none>_>_>
       ::dtor_impl;
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = &PTR__i1_00103db0;
  local_20._M_t.super__Tuple_impl<0UL,_T_*,_std::default_delete<T>_>.
  super__Head_base<0UL,_T_*,_false>._M_head_impl =
       (tuple<T_*,_std::default_delete<T>_>)operator_new(8);
  *(undefined8 **)
   local_20._M_t.super__Tuple_impl<0UL,_T_*,_std::default_delete<T>_>.
   super__Head_base<0UL,_T_*,_false>._M_head_impl = puVar1;
  lVar2 = __dynamic_cast(puVar1,&i1::typeinfo,&impl1::typeinfo,0);
  if (lVar2 != 0) {
    std::unique_ptr<T,_std::default_delete<T>_>::~unique_ptr
              ((unique_ptr<T,_std::default_delete<T>_> *)&local_20);
    boost::ext::di::v1_3_0::scopes::instance::
    scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
    ::~scope(this);
    return 0;
  }
  __assert_fail("dynamic_cast<impl1*>(object->up.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp"
                ,0x29,"int main()");
}

Assistant:

int main() {
  auto injector = di::make_injector(module());
  auto object = injector.create<std::unique_ptr<T>>();
  assert(dynamic_cast<impl1*>(object->up.get()));
}